

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_fopen(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_vm *pjVar1;
  undefined8 *pChunk;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  void *pvVar5;
  char *pcVar6;
  jx9_value **ppjVar7;
  jx9_value *pResource;
  uint iFlags;
  byte *pbVar8;
  long lVar9;
  int imLen;
  char *zUri;
  int iLen;
  jx9_io_stream *local_40;
  undefined8 *local_38;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pcVar6 = "Expecting a file path or URL";
    iVar3 = 2;
LAB_0013667b:
    jx9_context_throw_error(pCtx,iVar3,pcVar6);
LAB_00136684:
    jx9_result_bool(pCtx,0);
    return 0;
  }
  zUri = jx9_value_to_string(*apArg,&iLen);
  if (nArg == 1) {
    imLen = 1;
    pbVar8 = (byte *)0x13e16b;
  }
  else {
    pbVar8 = (byte *)jx9_value_to_string(apArg[1],&imLen);
  }
  local_40 = jx9VmGetStreamDevice(pCtx->pVm,&zUri,iLen);
  if (local_40 == (jx9_io_stream *)0x0) {
    jx9_context_throw_error_format
              (pCtx,2,"No stream device is associated with the given URI(%s)",zUri);
    goto LAB_00136684;
  }
  iFlags = 1;
  local_38 = (undefined8 *)jx9_context_alloc_chunk(pCtx,0x38,1,0);
  if (local_38 == (undefined8 *)0x0) {
    pcVar6 = "JX9 is running out of memory";
    iVar3 = 1;
    goto LAB_0013667b;
  }
  if ((uint)nArg < 4) {
    ppjVar7 = apArg;
    if (local_40 == &sjx9Stream) goto LAB_00136755;
    pResource = (jx9_value *)0x0;
  }
  else {
    ppjVar7 = apArg + 3;
LAB_00136755:
    pResource = *ppjVar7;
  }
  pjVar1 = pCtx->pVm;
  *local_38 = local_40;
  local_38[3] = 0;
  local_38[4] = 0;
  local_38[2] = pjVar1;
  *(undefined4 *)(local_38 + 5) = 0;
  local_38[6] = 0xfeac1400000000;
  lVar9 = (long)imLen;
  if (lVar9 < 1) goto LAB_001368b4;
  bVar2 = *pbVar8 & 0xdf;
  if (bVar2 == 0x41) {
    pbVar4 = pbVar8 + 1;
    if (imLen == 1) {
      iFlags = 0x2a;
LAB_00136877:
      pbVar4 = pbVar8 + 1;
    }
    else {
      iFlags = (uint)(*pbVar4 == 0x2b) * 2 + 0x2a;
    }
  }
  else if (bVar2 == 0x43) {
    pbVar4 = pbVar8 + 1;
    if (imLen == 1) {
      iFlags = 10;
      goto LAB_00136877;
    }
    iFlags = (uint)(*pbVar4 == 0x2b) * 2 + 10;
  }
  else if (bVar2 == 0x58) {
    pbVar4 = pbVar8 + 1;
    iFlags = 0x42;
    if ((imLen != 1) && (((bVar2 = *pbVar4, bVar2 == 0x2b || (bVar2 == 0x72)) || (bVar2 == 0x52))))
    {
      iFlags = 0x44;
      goto LAB_00136877;
    }
  }
  else if (bVar2 == 0x57) {
    pbVar4 = pbVar8 + 1;
    iFlags = 0x1a;
    if ((imLen != 1) && (((bVar2 = *pbVar4, bVar2 == 0x2b || (bVar2 == 0x72)) || (bVar2 == 0x52))))
    {
      iFlags = 0x1c;
      goto LAB_00136877;
    }
  }
  else if (bVar2 == 0x52) {
    pbVar4 = pbVar8 + 1;
    iFlags = 1;
    if ((imLen != 1) && (((bVar2 = *pbVar4, bVar2 == 0x2b || (bVar2 == 0x77)) || (bVar2 == 0x57))))
    {
      iFlags = 4;
      goto LAB_00136877;
    }
  }
  else {
    jx9_context_throw_error(pCtx,3,"Invalid open mode, JX9 is assuming a Read-Only open");
    iFlags = 1;
    pbVar4 = pbVar8;
  }
  for (; pbVar4 < pbVar8 + lVar9; pbVar4 = pbVar4 + 1) {
    if ((*pbVar4 & 0xdf) == 0x54) {
      iFlags = iFlags & 0xfffffd7f | 0x200;
    }
    else if ((*pbVar4 & 0xdf) == 0x42) {
      iFlags = iFlags & 0xfffffd7f | 0x80;
    }
  }
LAB_001368b4:
  pcVar6 = zUri;
  pjVar1 = pCtx->pVm;
  iVar3 = 0;
  if (2 < nArg) {
    iVar3 = jx9_value_to_bool(apArg[2]);
  }
  pvVar5 = jx9StreamOpenHandle(pjVar1,local_40,pcVar6,iFlags,iVar3,pResource,0,(int *)0x0);
  pChunk = local_38;
  local_38[1] = pvVar5;
  if (pvVar5 != (void *)0x0) {
    jx9_result_resource(pCtx,local_38);
    return 0;
  }
  jx9_context_throw_error_format(pCtx,1,"IO error while opening \'%s\'",pcVar6);
  jx9_result_bool(pCtx,0);
  jx9_context_free_chunk(pCtx,pChunk);
  return 0;
}

Assistant:

static int jx9Builtin_fopen(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zUri, *zMode;
	jx9_value *pResource;
	io_private *pDev;
	int iLen, imLen;
	int iOpenFlags;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a file path or URL");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the URI and the desired access mode */
	zUri  = jx9_value_to_string(apArg[0], &iLen);
	if( nArg > 1 ){
		zMode = jx9_value_to_string(apArg[1], &imLen);
	}else{
		/* Set a default read-only mode */
		zMode = "r";
		imLen = (int)sizeof(char);
	}
	/* Try to extract a stream */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zUri, iLen);
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"No stream device is associated with the given URI(%s)", zUri);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	pResource = 0;
	if( nArg > 3 ){
		pResource = apArg[3];
	}else if( is_jx9_stream(pStream) ){
		/* TICKET 1433-80: The jx9:// stream need a jx9_value to access the underlying
		 * virtual machine.
		 */
		pResource = apArg[0];
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	/* Convert open mode to JX9 flags */
	iOpenFlags = StrModeToFlags(pCtx, zMode, imLen);
	/* Try to get a handle */
	pDev->pHandle = jx9StreamOpenHandle(pCtx->pVm, pStream, zUri, iOpenFlags, 
		nArg > 2 ? jx9_value_to_bool(apArg[2]) : FALSE, pResource, FALSE, 0);
	if( pDev->pHandle == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_ERR, "IO error while opening '%s'", zUri);
		jx9_result_bool(pCtx, 0);
		jx9_context_free_chunk(pCtx, pDev);
		return JX9_OK;
	}
	/* All done, return the io_private instance as a resource */
	jx9_result_resource(pCtx, pDev);
	return JX9_OK;
}